

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O2

bool compare(string *left,string *right,bool sensitive)

{
  int iVar1;
  undefined7 in_register_00000011;
  bool bVar2;
  
  if ((int)CONCAT71(in_register_00000011,sensitive) == 0) {
    iVar1 = strcasecmp((left->_M_dataplus)._M_p,(right->_M_dataplus)._M_p);
    return iVar1 == 0;
  }
  if (left->_M_string_length == right->_M_string_length) {
    iVar1 = std::char_traits<char>::compare
                      ((left->_M_dataplus)._M_p,(right->_M_dataplus)._M_p,left->_M_string_length);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool compare (
  const std::string& left,
  const std::string& right,
  bool sensitive /*= true*/)
{
  // Use strcasecmp if required.
  if (! sensitive)
    return strcasecmp (left.c_str (), right.c_str ()) == 0;

  // Otherwise, just use std::string::operator==.
  return left == right;
}